

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorFixSize.h
# Opt level: O1

bool __thiscall
iDynTree::AttitudeMahonyFilter::getDefaultInternalInitialState
          (AttitudeMahonyFilter *this,Span<double,__1L> *stateBuffer)

{
  pointer peVar1;
  
  peVar1 = (stateBuffer->storage_).data_;
  *peVar1 = (this->m_initial_state_mahony).m_orientation.m_data[0];
  peVar1[1] = (this->m_initial_state_mahony).m_orientation.m_data[1];
  peVar1[2] = (this->m_initial_state_mahony).m_orientation.m_data[2];
  peVar1[3] = (this->m_initial_state_mahony).m_orientation.m_data[3];
  peVar1[4] = (this->m_initial_state_mahony).m_angular_velocity.m_data[0];
  peVar1[5] = (this->m_initial_state_mahony).m_angular_velocity.m_data[1];
  peVar1[6] = (this->m_initial_state_mahony).m_angular_velocity.m_data[2];
  peVar1[7] = (this->m_initial_state_mahony).m_gyroscope_bias.m_data[0];
  peVar1[8] = (this->m_initial_state_mahony).m_gyroscope_bias.m_data[1];
  peVar1[9] = (this->m_initial_state_mahony).m_gyroscope_bias.m_data[2];
  return true;
}

Assistant:

double VectorFixSize<VecSize>::operator()(const std::size_t index) const
    {
        assert(index < VecSize);
        return this->m_data[index];
    }